

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodFactory.hpp
# Opt level: O0

unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_> __thiscall
OpenMD::RNEMD::MethodFactory::create(MethodFactory *this,SimInfo *info,ForceManager *forceMan)

{
  bool bVar1;
  unique_ptr<OpenMD::RNEMD::NIVSMethod,_std::default_delete<OpenMD::RNEMD::NIVSMethod>_> *in_RSI;
  RNEMD *in_RDI;
  _Head_base<0UL,_OpenMD::RNEMD::RNEMD_*,_false> __lhs;
  unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
  *in_stack_ffffffffffffffc0;
  ForceManager **in_stack_ffffffffffffffd0;
  SimInfo **in_stack_ffffffffffffffd8;
  
  __lhs._M_head_impl = in_RDI;
  bVar1 = std::operator==((basic_string<char,_OpenMD::Utils::ci_char_traits,_std::allocator<char>_>
                           *)in_RDI,(char *)in_RDI);
  if (bVar1) {
    std::make_unique<OpenMD::RNEMD::SwapMethod,OpenMD::SimInfo*&,OpenMD::ForceManager*&>
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::unique_ptr<OpenMD::RNEMD::RNEMD,std::default_delete<OpenMD::RNEMD::RNEMD>>::
    unique_ptr<OpenMD::RNEMD::SwapMethod,std::default_delete<OpenMD::RNEMD::SwapMethod>,void>
              (in_stack_ffffffffffffffc0,
               (unique_ptr<OpenMD::RNEMD::SwapMethod,_std::default_delete<OpenMD::RNEMD::SwapMethod>_>
                *)in_RSI);
    std::unique_ptr<OpenMD::RNEMD::SwapMethod,_std::default_delete<OpenMD::RNEMD::SwapMethod>_>::
    ~unique_ptr((unique_ptr<OpenMD::RNEMD::SwapMethod,_std::default_delete<OpenMD::RNEMD::SwapMethod>_>
                 *)__lhs._M_head_impl);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_OpenMD::Utils::ci_char_traits,_std::allocator<char>_>
                             *)__lhs._M_head_impl,(char *)in_RDI);
    if (bVar1) {
      std::make_unique<OpenMD::RNEMD::NIVSMethod,OpenMD::SimInfo*&,OpenMD::ForceManager*&>
                (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      std::unique_ptr<OpenMD::RNEMD::RNEMD,std::default_delete<OpenMD::RNEMD::RNEMD>>::
      unique_ptr<OpenMD::RNEMD::NIVSMethod,std::default_delete<OpenMD::RNEMD::NIVSMethod>,void>
                (in_stack_ffffffffffffffc0,in_RSI);
      std::unique_ptr<OpenMD::RNEMD::NIVSMethod,_std::default_delete<OpenMD::RNEMD::NIVSMethod>_>::
      ~unique_ptr((unique_ptr<OpenMD::RNEMD::NIVSMethod,_std::default_delete<OpenMD::RNEMD::NIVSMethod>_>
                   *)__lhs._M_head_impl);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_OpenMD::Utils::ci_char_traits,_std::allocator<char>_>
                               *)__lhs._M_head_impl,(char *)in_RDI);
      if (bVar1) {
        std::make_unique<OpenMD::RNEMD::SPFMethod,OpenMD::SimInfo*&,OpenMD::ForceManager*&>
                  (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
        std::unique_ptr<OpenMD::RNEMD::RNEMD,std::default_delete<OpenMD::RNEMD::RNEMD>>::
        unique_ptr<OpenMD::RNEMD::SPFMethod,std::default_delete<OpenMD::RNEMD::SPFMethod>,void>
                  (in_stack_ffffffffffffffc0,
                   (unique_ptr<OpenMD::RNEMD::SPFMethod,_std::default_delete<OpenMD::RNEMD::SPFMethod>_>
                    *)in_RSI);
        std::unique_ptr<OpenMD::RNEMD::SPFMethod,_std::default_delete<OpenMD::RNEMD::SPFMethod>_>::
        ~unique_ptr((unique_ptr<OpenMD::RNEMD::SPFMethod,_std::default_delete<OpenMD::RNEMD::SPFMethod>_>
                     *)__lhs._M_head_impl);
      }
      else {
        std::make_unique<OpenMD::RNEMD::VSSMethod,OpenMD::SimInfo*&,OpenMD::ForceManager*&>
                  (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
        std::unique_ptr<OpenMD::RNEMD::RNEMD,std::default_delete<OpenMD::RNEMD::RNEMD>>::
        unique_ptr<OpenMD::RNEMD::VSSMethod,std::default_delete<OpenMD::RNEMD::VSSMethod>,void>
                  (in_stack_ffffffffffffffc0,
                   (unique_ptr<OpenMD::RNEMD::VSSMethod,_std::default_delete<OpenMD::RNEMD::VSSMethod>_>
                    *)in_RSI);
        std::unique_ptr<OpenMD::RNEMD::VSSMethod,_std::default_delete<OpenMD::RNEMD::VSSMethod>_>::
        ~unique_ptr((unique_ptr<OpenMD::RNEMD::VSSMethod,_std::default_delete<OpenMD::RNEMD::VSSMethod>_>
                     *)__lhs._M_head_impl);
      }
    }
  }
  return (__uniq_ptr_data<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>,_true,_true>
          )(tuple<OpenMD::RNEMD::RNEMD_*,_std::default_delete<OpenMD::RNEMD::RNEMD>_>)
           __lhs._M_head_impl;
}

Assistant:

std::unique_ptr<RNEMD> create(SimInfo* info, ForceManager* forceMan) {
      if (methodStr_ == "Swap")
        return std::make_unique<SwapMethod>(info, forceMan);

      else if (methodStr_ == "NIVS")
        return std::make_unique<NIVSMethod>(info, forceMan);

      else if (methodStr_ == "SPF")
        return std::make_unique<SPFMethod>(info, forceMan);

      else
        return std::make_unique<VSSMethod>(info, forceMan);
    }